

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

void http1_websocket_client_on_failed(http_s *h)

{
  http_settings_s *phVar1;
  void *ptr;
  
  ptr = h->udata;
  if (*(code **)((long)ptr + 0x20) != (code *)0x0) {
    (**(code **)((long)ptr + 0x20))(0,*(undefined8 *)((long)ptr + 0x28));
    ptr = h->udata;
  }
  fio_free(ptr);
  phVar1 = http_settings(h);
  phVar1->udata = (void *)0x0;
  h->udata = (void *)0x0;
  return;
}

Assistant:

static void http1_websocket_client_on_failed(http_s *h) {
  websocket_settings_s *s = h->udata;
  if (s->on_close)
    s->on_close(0, s->udata);
  fio_free(h->udata);
  h->udata = http_settings(h)->udata = NULL;
}